

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<double>::Resize
          (RepeatedField<double> *this,int new_size,double *value)

{
  double dVar1;
  int iVar2;
  LogMessage *other;
  double *pdVar3;
  double *pdVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x50b);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pdVar3 = elements(this);
    iVar2 = this->current_size_;
    pdVar4 = elements(this);
    dVar1 = *value;
    for (pdVar3 = pdVar3 + iVar2; pdVar3 != pdVar4 + new_size; pdVar3 = pdVar3 + 1) {
      *pdVar3 = dVar1;
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}